

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPCMacAlgorithm::signFinal(OSSLEVPCMacAlgorithm *this,ByteString *signature)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uchar *out;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  size_t outLen;
  size_t in_stack_ffffffffffffffc8;
  ByteString *in_stack_ffffffffffffffd0;
  ByteString *this_00;
  size_t local_20 [3];
  bool local_1;
  
  bVar1 = MacAlgorithm::signFinal(in_RDI,in_RSI);
  if (bVar1) {
    iVar2 = (*in_RDI->_vptr_MacAlgorithm[0xb])();
    local_20[0] = CONCAT44(extraout_var,iVar2);
    ByteString::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this_00 = (ByteString *)in_RDI[1]._vptr_MacAlgorithm;
    out = ByteString::operator[](this_00,in_stack_ffffffffffffffc8);
    iVar2 = CMAC_Final((CMAC_CTX *)this_00,out,local_20);
    if (iVar2 == 0) {
      softHSMLog(3,"signFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0x83,"CMAC_Final failed");
      CMAC_CTX_free((CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = false;
    }
    else {
      ByteString::resize(this_00,in_stack_ffffffffffffffc8);
      CMAC_CTX_free((CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OSSLEVPCMacAlgorithm::signFinal(ByteString& signature)
{
	if (!MacAlgorithm::signFinal(signature))
	{
		return false;
	}

	size_t outLen = getMacSize();
	signature.resize(outLen);

	if (!CMAC_Final(curCTX, &signature[0], &outLen))
	{
		ERROR_MSG("CMAC_Final failed");

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	signature.resize(outLen);

	CMAC_CTX_free(curCTX);
	curCTX = NULL;

	return true;
}